

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::timestamp_t,double,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (timestamp_t *adata,AggregateInputData *aggr_input_data,double *bdata,
               ArgMinMaxState<duckdb::timestamp_t,_double> **states,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *ssel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  ArgMinMaxState<duckdb::timestamp_t,_double> *pAVar2;
  AggregateInputData *in_RSI;
  ulong in_R8;
  SelectionVector *in_R9;
  idx_t sidx_1;
  idx_t i_1;
  idx_t sidx;
  idx_t i;
  AggregateBinaryInput input;
  idx_t in_stack_ffffffffffffff90;
  ulong idx;
  ulong local_60;
  AggregateBinaryInput *in_stack_ffffffffffffffa8;
  ValidityMask *in_stack_ffffffffffffffb0;
  ValidityMask *in_stack_ffffffffffffffb8;
  
  AggregateBinaryInput::AggregateBinaryInput
            ((AggregateBinaryInput *)&stack0xffffffffffffffa8,in_RSI,(ValidityMask *)i,
             (ValidityMask *)input.input);
  bVar1 = ArgMinMaxBase<duckdb::GreaterThan,_true>::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)i), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1)))) {
    for (idx = 0; idx < in_R8; idx = idx + 1) {
      pAVar2 = (ArgMinMaxState<duckdb::timestamp_t,_double> *)SelectionVector::get_index(in_R9,idx);
      SelectionVector::get_index((SelectionVector *)i_1,idx);
      SelectionVector::get_index((SelectionVector *)sidx,idx);
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Operation<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                (pAVar2,(timestamp_t *)in_stack_ffffffffffffffb8,(double *)in_stack_ffffffffffffffb0
                 ,in_stack_ffffffffffffffa8);
    }
  }
  else {
    for (local_60 = 0; local_60 < in_R8; local_60 = local_60 + 1) {
      pAVar2 = (ArgMinMaxState<duckdb::timestamp_t,_double> *)
               SelectionVector::get_index(in_R9,local_60);
      SelectionVector::get_index((SelectionVector *)i_1,local_60);
      this = (TemplatedValidityMask<unsigned_long> *)
             SelectionVector::get_index((SelectionVector *)sidx,local_60);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,in_stack_ffffffffffffff90),
         bVar1)) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  (pAVar2,(timestamp_t *)in_stack_ffffffffffffffb8,
                   (double *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}